

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

int __thiscall wallet::CWallet::GetTxDepthInMainChain(CWallet *this,CWalletTx *wtx)

{
  long lVar1;
  int iVar2;
  TxStateConfirmed *pTVar3;
  TxStateBlockConflicted *pTVar4;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  TxStateBlockConflicted *conf_1;
  TxStateConfirmed *conf;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc,(AnnotatedMixin<std::recursive_mutex> *)0x17028a9);
  pTVar3 = CWalletTx::state<wallet::TxStateConfirmed>
                     ((CWalletTx *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (pTVar3 == (TxStateConfirmed *)0x0) {
    pTVar4 = CWalletTx::state<wallet::TxStateBlockConflicted>
                       ((CWalletTx *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (pTVar4 == (TxStateBlockConflicted *)0x0) {
      local_c = 0;
    }
    else {
      if (pTVar4->conflicting_block_height < 0) {
        __assert_fail("conf->conflicting_block_height >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                      ,0xd76,"int wallet::CWallet::GetTxDepthInMainChain(const CWalletTx &) const");
      }
      iVar2 = GetLastBlockHeight(in_RDI);
      local_c = -((iVar2 - pTVar4->conflicting_block_height) + 1);
    }
  }
  else {
    if (pTVar3->confirmed_block_height < 0) {
      __assert_fail("conf->confirmed_block_height >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                    ,0xd73,"int wallet::CWallet::GetTxDepthInMainChain(const CWalletTx &) const");
    }
    iVar2 = GetLastBlockHeight(in_RDI);
    local_c = (iVar2 - pTVar3->confirmed_block_height) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

int CWallet::GetTxDepthInMainChain(const CWalletTx& wtx) const
{
    AssertLockHeld(cs_wallet);
    if (auto* conf = wtx.state<TxStateConfirmed>()) {
        assert(conf->confirmed_block_height >= 0);
        return GetLastBlockHeight() - conf->confirmed_block_height + 1;
    } else if (auto* conf = wtx.state<TxStateBlockConflicted>()) {
        assert(conf->conflicting_block_height >= 0);
        return -1 * (GetLastBlockHeight() - conf->conflicting_block_height + 1);
    } else {
        return 0;
    }
}